

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_free_l_acc(gauden_t *g)

{
  if (g->l_macc != (vector_t ***)0x0) {
    gauden_free_param(g->l_macc);
  }
  g->l_macc = (vector_t ***)0x0;
  if (g->l_vacc != (vector_t ***)0x0) {
    gauden_free_param(g->l_vacc);
  }
  g->l_vacc = (vector_t ***)0x0;
  if (g->l_fullvacc != (vector_t ****)0x0) {
    gauden_free_param_full(g->l_fullvacc);
  }
  g->l_fullvacc = (vector_t ****)0x0;
  if (g->l_dnom != (float32 ***)0x0) {
    ckd_free_3d(g->l_dnom);
  }
  g->l_dnom = (float32 ***)0x0;
  return;
}

Assistant:

void
gauden_free_l_acc(gauden_t *g)
{
    if (g->l_macc) {
	gauden_free_param(g->l_macc);
    }
    g->l_macc = NULL;

    if (g->l_vacc) {
	gauden_free_param(g->l_vacc);
    }
    g->l_vacc = NULL;

    if (g->l_fullvacc) {
	gauden_free_param_full(g->l_fullvacc);
    }
    g->l_fullvacc = NULL;

    if (g->l_dnom) {
	ckd_free_3d((void ***)g->l_dnom);
    }
    g->l_dnom = NULL;
}